

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O1

void __thiscall
cmExportFileGenerator::GenerateImportTargetCode
          (cmExportFileGenerator *this,ostream *os,cmGeneratorTarget *target,TargetType targetType)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  bool bVar4;
  ostream *poVar5;
  long lVar6;
  char *pcVar7;
  string targetName;
  long *local_a8;
  long local_a0;
  long local_98 [2];
  string local_88;
  string local_68;
  string local_48;
  
  pcVar2 = (this->Namespace)._M_dataplus._M_p;
  local_a8 = local_98;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,pcVar2,pcVar2 + (this->Namespace)._M_string_length);
  cmGeneratorTarget::GetExportName_abi_cxx11_(&local_68,target);
  std::__cxx11::string::_M_append((char *)&local_a8,(ulong)local_68._M_dataplus._M_p);
  paVar1 = &local_68.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"# Create imported target ",0x19);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_a8,local_a0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  switch(targetType) {
  case EXECUTABLE:
    std::__ostream_insert<char,std::char_traits<char>>(os,"add_executable(",0xf);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_a8,local_a0);
    lVar6 = 0xb;
    pcVar7 = " IMPORTED)\n";
    break;
  case STATIC_LIBRARY:
    std::__ostream_insert<char,std::char_traits<char>>(os,"add_library(",0xc);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_a8,local_a0);
    lVar6 = 0x12;
    pcVar7 = " STATIC IMPORTED)\n";
    break;
  case SHARED_LIBRARY:
    std::__ostream_insert<char,std::char_traits<char>>(os,"add_library(",0xc);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_a8,local_a0);
    lVar6 = 0x12;
    pcVar7 = " SHARED IMPORTED)\n";
    break;
  case MODULE_LIBRARY:
    std::__ostream_insert<char,std::char_traits<char>>(os,"add_library(",0xc);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_a8,local_a0);
    lVar6 = 0x12;
    pcVar7 = " MODULE IMPORTED)\n";
    break;
  case OBJECT_LIBRARY:
    std::__ostream_insert<char,std::char_traits<char>>(os,"add_library(",0xc);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_a8,local_a0);
    lVar6 = 0x12;
    pcVar7 = " OBJECT IMPORTED)\n";
    break;
  default:
    goto switchD_00394e28_caseD_5;
  case INTERFACE_LIBRARY:
    std::__ostream_insert<char,std::char_traits<char>>(os,"add_library(",0xc);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_a8,local_a0);
    lVar6 = 0x15;
    pcVar7 = " INTERFACE IMPORTED)\n";
    break;
  case UNKNOWN_LIBRARY:
    std::__ostream_insert<char,std::char_traits<char>>(os,"add_library(",0xc);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_a8,local_a0);
    lVar6 = 0x13;
    pcVar7 = " UNKNOWN IMPORTED)\n";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar7,lVar6);
switchD_00394e28_caseD_5:
  bVar3 = cmGeneratorTarget::IsExecutableWithExports(target);
  if (bVar3) {
    bVar4 = true;
    bVar3 = false;
  }
  else {
    bVar3 = cmGeneratorTarget::IsSharedLibraryWithExports(target);
    if (bVar3) {
      local_68._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"");
      bVar4 = cmGeneratorTarget::HasImportLibrary(target,&local_68);
      bVar3 = true;
    }
    else {
      bVar3 = false;
      bVar4 = false;
    }
  }
  if ((bVar3) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1)) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (bVar4 != false) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"set_property(TARGET ",0x14);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_a8,local_a0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," PROPERTY ENABLE_EXPORTS 1)\n",0x1c);
  }
  bVar3 = cmGeneratorTarget::IsFrameworkOnApple(target);
  if (bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"set_property(TARGET ",0x14);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_a8,local_a0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," PROPERTY FRAMEWORK 1)\n",0x17);
  }
  bVar3 = cmGeneratorTarget::IsAppBundleOnApple(target);
  if (bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"set_property(TARGET ",0x14);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_a8,local_a0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," PROPERTY MACOSX_BUNDLE 1)\n",0x1b);
  }
  bVar3 = cmGeneratorTarget::IsCFBundleOnApple(target);
  if (bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"set_property(TARGET ",0x14);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_a8,local_a0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," PROPERTY BUNDLE 1)\n",0x14);
  }
  bVar3 = cmGeneratorTarget::IsDeprecated(target);
  if (bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"set_property(TARGET ",0x14);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_a8,local_a0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," PROPERTY DEPRECATION ",0x16);
    cmGeneratorTarget::GetDeprecation_abi_cxx11_(&local_48,target);
    cmExportFileGeneratorEscape(&local_88,&local_48);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_88._M_dataplus._M_p,local_88._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,")\n",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  paVar1 = &local_88.field_2;
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"IMPORTED_NO_SYSTEM","");
  bVar3 = cmGeneratorTarget::GetPropertyAsBool(target,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if (bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"set_property(TARGET ",0x14);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_a8,local_a0);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5," PROPERTY IMPORTED_NO_SYSTEM 1)\n",0x20);
  }
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"EXPORT_NO_SYSTEM","");
  bVar3 = cmGeneratorTarget::GetPropertyAsBool(target,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if (bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"set_property(TARGET ",0x14);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_a8,local_a0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," PROPERTY SYSTEM 0)\n",0x14);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
  if (local_a8 != local_98) {
    operator_delete(local_a8,local_98[0] + 1);
  }
  return;
}

Assistant:

void cmExportFileGenerator::GenerateImportTargetCode(
  std::ostream& os, cmGeneratorTarget const* target,
  cmStateEnums::TargetType targetType)
{
  // Construct the imported target name.
  std::string targetName = this->Namespace;

  targetName += target->GetExportName();

  // Create the imported target.
  os << "# Create imported target " << targetName << "\n";
  switch (targetType) {
    case cmStateEnums::EXECUTABLE:
      os << "add_executable(" << targetName << " IMPORTED)\n";
      break;
    case cmStateEnums::STATIC_LIBRARY:
      os << "add_library(" << targetName << " STATIC IMPORTED)\n";
      break;
    case cmStateEnums::SHARED_LIBRARY:
      os << "add_library(" << targetName << " SHARED IMPORTED)\n";
      break;
    case cmStateEnums::MODULE_LIBRARY:
      os << "add_library(" << targetName << " MODULE IMPORTED)\n";
      break;
    case cmStateEnums::UNKNOWN_LIBRARY:
      os << "add_library(" << targetName << " UNKNOWN IMPORTED)\n";
      break;
    case cmStateEnums::OBJECT_LIBRARY:
      os << "add_library(" << targetName << " OBJECT IMPORTED)\n";
      break;
    case cmStateEnums::INTERFACE_LIBRARY:
      os << "add_library(" << targetName << " INTERFACE IMPORTED)\n";
      break;
    default: // should never happen
      break;
  }

  // Mark the imported executable if it has exports.
  if (target->IsExecutableWithExports() ||
      (target->IsSharedLibraryWithExports() && target->HasImportLibrary(""))) {
    os << "set_property(TARGET " << targetName
       << " PROPERTY ENABLE_EXPORTS 1)\n";
  }

  // Mark the imported library if it is a framework.
  if (target->IsFrameworkOnApple()) {
    os << "set_property(TARGET " << targetName << " PROPERTY FRAMEWORK 1)\n";
  }

  // Mark the imported executable if it is an application bundle.
  if (target->IsAppBundleOnApple()) {
    os << "set_property(TARGET " << targetName
       << " PROPERTY MACOSX_BUNDLE 1)\n";
  }

  if (target->IsCFBundleOnApple()) {
    os << "set_property(TARGET " << targetName << " PROPERTY BUNDLE 1)\n";
  }

  // generate DEPRECATION
  if (target->IsDeprecated()) {
    os << "set_property(TARGET " << targetName << " PROPERTY DEPRECATION "
       << cmExportFileGeneratorEscape(target->GetDeprecation()) << ")\n";
  }

  if (target->GetPropertyAsBool("IMPORTED_NO_SYSTEM")) {
    os << "set_property(TARGET " << targetName
       << " PROPERTY IMPORTED_NO_SYSTEM 1)\n";
  }

  if (target->GetPropertyAsBool("EXPORT_NO_SYSTEM")) {
    os << "set_property(TARGET " << targetName << " PROPERTY SYSTEM 0)\n";
  }

  os << "\n";
}